

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O3

Status __thiscall
leveldb::SetCurrentFile(leveldb *this,Env *env,string *dbname,uint64_t descriptor_number)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  _Alloc_hider __s1;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  Status *s;
  string tmp;
  string manifest;
  void *local_d0;
  Slice local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  DescriptorFileName(&local_58,dbname,descriptor_number);
  __s1._M_p = local_58._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar2 = (dbname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + dbname->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_78,"/");
  _Var3._M_p = local_78._M_dataplus._M_p;
  if (local_58._M_string_length < local_78._M_string_length) {
LAB_00642b0c:
    __assert_fail("contents.starts_with(dbname + \"/\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/filename.cc"
                  ,0x80,"Status leveldb::SetCurrentFile(Env *, const std::string &, uint64_t)");
  }
  iVar4 = bcmp(__s1._M_p,local_78._M_dataplus._M_p,local_78._M_string_length);
  if (iVar4 != 0) goto LAB_00642b0c;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != &local_78.field_2) {
    operator_delete(_Var3._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  uVar7 = dbname->_M_string_length + 1;
  if (local_58._M_string_length < uVar7) {
    __assert_fail("n <= size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/include/leveldb/slice.h"
                  ,0x46,"void leveldb::Slice::remove_prefix(size_t)");
  }
  TempFileName(&local_78,dbname,descriptor_number);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,__s1._M_p + uVar7,__s1._M_p + local_58._M_string_length);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_b8,"\n");
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == paVar6) {
    local_98.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_c8.size_ = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_c8.data_ = local_98._M_dataplus._M_p;
  local_98._M_string_length = local_c8.size_;
  WriteStringToFileSync(this,env,&local_c8,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)this == 0) {
    CurrentFileName(&local_98,dbname);
    (*env->_vptr_Env[0xc])(&local_b8,env,&local_78,&local_98);
    paVar6 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)this;
    *(pointer *)this = local_b8._M_dataplus._M_p;
    local_b8._M_dataplus._M_p = (pointer)paVar6;
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
      operator_delete__(paVar6);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)this == 0) goto LAB_00642aa3;
  }
  (*env->_vptr_Env[8])(&local_d0,env,&local_78);
  if (local_d0 != (void *)0x0) {
    operator_delete__(local_d0);
  }
LAB_00642aa3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status SetCurrentFile(Env* env, const std::string& dbname,
                      uint64_t descriptor_number) {
  // Remove leading "dbname/" and add newline to manifest file name
  std::string manifest = DescriptorFileName(dbname, descriptor_number);
  Slice contents = manifest;
  assert(contents.starts_with(dbname + "/"));
  contents.remove_prefix(dbname.size() + 1);
  std::string tmp = TempFileName(dbname, descriptor_number);
  Status s = WriteStringToFileSync(env, contents.ToString() + "\n", tmp);
  if (s.ok()) {
    s = env->RenameFile(tmp, CurrentFileName(dbname));
  }
  if (!s.ok()) {
    env->DeleteFile(tmp);
  }
  return s;
}